

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

void __thiscall
cmProjectCommand::TopLevelCMakeVarCondSet(cmProjectCommand *this,char *name,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator<char> local_49;
  string local_48;
  
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_48);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    bVar2 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar2) {
      return;
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  cmMakefile::AddDefinition(pcVar1,&local_48,value);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  cmMakefile::AddCacheDefinition(pcVar1,&local_48,value,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmProjectCommand::TopLevelCMakeVarCondSet(const char* const name,
                                               const char* const value)
{
  // Set the CMAKE_PROJECT_XXX variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one.
  if (!this->Makefile->GetDefinition(name) ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition(name, value);
    this->Makefile->AddCacheDefinition(name, value, "Value Computed by CMake",
                                       cmStateEnums::STATIC);
  }
}